

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void dbuf_put_leb128(DynBuf *s,uint32_t v)

{
  for (; 0x7f < v; v = v >> 7) {
    dbuf_putc(s,(byte)v | 0x80);
  }
  dbuf_putc(s,(byte)v);
  return;
}

Assistant:

static void dbuf_put_leb128(DynBuf *s, uint32_t v)
{
    uint32_t a;
    for(;;) {
        a = v & 0x7f;
        v >>= 7;
        if (v != 0) {
            dbuf_putc(s, a | 0x80);
        } else {
            dbuf_putc(s, a);
            break;
        }
    }
}